

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::rewind_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  int local_2c;
  int lineCount;
  int gapLen;
  int pos;
  int nLines_local;
  int startPos_local;
  Fl_Text_Buffer *this_local;
  
  lineCount = startPos + -1;
  if (0 < lineCount) {
    local_2c = -1;
    for (; this->mGapStart <= lineCount; lineCount = lineCount + -1) {
      if ((this->mBuf[lineCount + (this->mGapEnd - this->mGapStart)] == '\n') &&
         (local_2c = local_2c + 1, nLines <= local_2c)) {
        return lineCount + 1;
      }
    }
    for (; -1 < lineCount; lineCount = lineCount + -1) {
      if ((this->mBuf[lineCount] == '\n') && (local_2c = local_2c + 1, nLines <= local_2c)) {
        return lineCount + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::rewind_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  int pos = startPos - 1;
  if (pos <= 0)
    return 0;
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = -1;
  while (pos >= mGapStart) {
    if (mBuf[pos + gapLen] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  while (pos >= 0) {
    if (mBuf[pos] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  return 0;
}